

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborTag __thiscall QCborValue::tag(QCborValue *this,QCborTag defaultValue)

{
  bool bVar1;
  qsizetype qVar2;
  const_reference pEVar3;
  QCborTag in_RSI;
  long in_RDI;
  qsizetype in_stack_ffffffffffffffd8;
  QList<QtCbor::Element> *in_stack_ffffffffffffffe0;
  
  bVar1 = isTag((QCborValue *)0x470221);
  if (((bVar1) && (*(long *)(in_RDI + 8) != 0)) &&
     (qVar2 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(*(long *)(in_RDI + 8) + 0x28))
     , qVar2 == 2)) {
    pEVar3 = QList<QtCbor::Element>::at(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RSI = (pEVar3->field_0).value;
  }
  return in_RSI;
}

Assistant:

QCborTag QCborValue::tag(QCborTag defaultValue) const
{
    return isTag() && container && container->elements.size() == 2 ?
                QCborTag(container->elements.at(0).value) : defaultValue;
}